

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O0

void __thiscall
OpenMD::SectionParserManager::insert(SectionParserManager *this,SectionParser *sp,int priority)

{
  bool bVar1;
  string *psVar2;
  iterator __position;
  iterator this_00;
  pointer pSVar3;
  ostream *poVar4;
  int in_EDX;
  SectionParser *in_RSI;
  value_type *in_RDI;
  SectionParserContext context;
  iterator i;
  list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
  *in_stack_ffffffffffffff58;
  fpos<__mbstate_t> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff70;
  _List_const_iterator<OpenMD::SectionParserContext> in_stack_ffffffffffffff78;
  _Self local_30;
  _List_node_base *local_28;
  _List_iterator<OpenMD::SectionParserContext> local_20;
  int local_14;
  SectionParser *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::_List_iterator<OpenMD::SectionParserContext>::_List_iterator(&local_20);
  SectionParser::getSectionName_abi_cxx11_(local_10);
  local_28 = (_List_node_base *)
             findSectionParser(in_stack_ffffffffffffff78._M_node,in_stack_ffffffffffffff70);
  local_20._M_node = local_28;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::end
                 (in_stack_ffffffffffffff58);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    psVar2 = SectionParser::getSectionName_abi_cxx11_(local_10);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)psVar2);
    poVar4 = std::operator<<(poVar4," section parser already exists");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  SectionParserContext::SectionParserContext((SectionParserContext *)0x2853b9);
  std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff60,(streamoff)in_stack_ffffffffffffff58);
  bVar1 = std::__cxx11::
          list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::empty
                    ((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                      *)&in_RDI->sectionParser);
  if (bVar1) {
    std::__cxx11::list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
    ::push_back((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_> *
                )in_stack_ffffffffffffff70,in_RDI);
  }
  else {
    __position = std::__cxx11::
                 list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
                 begin(in_stack_ffffffffffffff58);
    local_20._M_node = __position._M_node;
    while( true ) {
      this_00 = std::__cxx11::
                list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
                end(in_stack_ffffffffffffff58);
      bVar1 = std::operator!=(&local_20,(_Self *)&stack0xffffffffffffff80);
      if (!bVar1) break;
      pSVar3 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                         ((_List_iterator<OpenMD::SectionParserContext> *)0x285487);
      if (pSVar3->priority == local_14) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Priority ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
        poVar4 = std::operator<<(poVar4," already used");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        return;
      }
      pSVar3 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                         ((_List_iterator<OpenMD::SectionParserContext> *)0x2854e1);
      if (local_14 < pSVar3->priority) {
        std::_List_const_iterator<OpenMD::SectionParserContext>::_List_const_iterator
                  ((_List_const_iterator<OpenMD::SectionParserContext> *)&stack0xffffffffffffff78,
                   &local_20);
        std::__cxx11::
        list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::insert
                  ((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                    *)this_00._M_node,(const_iterator)__position._M_node,
                   (value_type *)in_stack_ffffffffffffff78._M_node);
        return;
      }
      std::_List_iterator<OpenMD::SectionParserContext>::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void SectionParserManager::insert(SectionParser* sp, int priority) {
    SectionParserManager::iterator i;
    i = findSectionParser(sp->getSectionName());
    if (i != sectionParsers_.end()) {
      std::cerr << sp->getSectionName() << " section parser already exists"
                << std::endl;
    }

    SectionParserContext context;
    context.priority      = priority;
    context.sectionParser = sp;
    context.lineNo        = 0;
    context.offset        = 0;
    context.isActive      = false;

    if (sectionParsers_.empty()) {
      sectionParsers_.push_back(context);
    } else {
      for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
        if (i->priority == priority) {
          std::cerr << "Priority " << priority << " already used" << std::endl;
          return;
        } else if (i->priority > priority) {
          sectionParsers_.insert(i, context);
          break;
        }
      }
    }
  }